

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

string * __thiscall
soul::AST::CallOrCastBase::getDescription
          (string *__return_storage_ptr__,CallOrCastBase *this,string *name)

{
  Type *this_00;
  string *this_01;
  undefined1 in_R8B;
  ArrayView<soul::Type> types;
  ArrayView<soul::Type> AVar1;
  string local_160;
  string local_140;
  string local_120;
  ArrayView<soul::Type> local_100;
  TypeArray argTypes;
  
  getArgumentTypes(&argTypes,this);
  if (this->isMethodCall == true) {
    if (argTypes.numActive == 0) {
      throwInternalCompilerError("! argTypes.empty()","getDescription",0x893);
    }
    this_00 = ArrayWithPreallocation<soul::Type,_8UL>::front(&argTypes);
    Type::getDescription_abi_cxx11_(&local_120,this_00);
    TokenisedPathString::join(&local_160,&local_120,name);
    local_100.e = argTypes.items + argTypes.numActive;
    local_100.s = argTypes.items;
    AVar1 = ArrayView<soul::Type>::tail(&local_100);
    types.s = AVar1.e;
    types.e = (Type *)0x1;
    heart::Utilities::getDescriptionOfTypeList_abi_cxx11_
              (&local_140,(Utilities *)AVar1.s,types,(bool)in_R8B);
    std::operator+(__return_storage_ptr__,&local_160,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    this_01 = &local_120;
  }
  else {
    AVar1.s = argTypes.items + argTypes.numActive;
    AVar1.e = (Type *)0x1;
    heart::Utilities::getDescriptionOfTypeList_abi_cxx11_
              (&local_160,(Utilities *)argTypes.items,AVar1,(bool)in_R8B);
    std::operator+(__return_storage_ptr__,name,&local_160);
    this_01 = &local_160;
  }
  std::__cxx11::string::~string((string *)this_01);
  ArrayWithPreallocation<soul::Type,_8UL>::clear(&argTypes);
  return __return_storage_ptr__;
}

Assistant:

std::string getDescription (std::string name) const
        {
            auto argTypes = getArgumentTypes();

            if (isMethodCall)
            {
                SOUL_ASSERT (! argTypes.empty());

                return TokenisedPathString::join (argTypes.front().getDescription(), name)
                        + heart::Utilities::getDescriptionOfTypeList (ArrayView<Type> (argTypes).tail(), true);
            }

            return name + heart::Utilities::getDescriptionOfTypeList (argTypes, true);
        }